

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

void __thiscall rcg::Device::enableModuleEvents(Device *this)

{
  GC_ERROR GVar1;
  GenTLException *this_00;
  allocator local_41;
  string local_40;
  
  std::mutex::lock(&this->mtx);
  if ((this->dev != (EVENTSRC_HANDLE)0x0) && (this->event == (void *)0x0)) {
    GVar1 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->GCRegisterEvent)(this->dev,5,&this->event);
    if (GVar1 != 0) {
      this_00 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_40,"Device::enableModuleEvents()",&local_41);
      GenTLException::GenTLException(this_00,&local_40,&this->gentl);
      __cxa_throw(this_00,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void Device::enableModuleEvents()
{
  std::lock_guard<std::mutex> lock(mtx);

  if (dev && !event)
  {
    if (gentl->GCRegisterEvent(dev, GenTL::EVENT_MODULE, &event) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("Device::enableModuleEvents()", gentl);
    }
  }
}